

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::NonarrayType> __thiscall
mocker::Parser::nonarrayType(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  PosPair p;
  bool bVar1;
  element_type *this_01;
  mapped_type *pmVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<mocker::ast::NonarrayType> sVar4;
  NodeID local_a0;
  size_t local_98;
  size_t sStack_90;
  size_t local_88;
  size_t sStack_80;
  Parser local_70;
  undefined1 local_58 [8];
  shared_ptr<mocker::ast::Identifier> id;
  undefined1 local_38 [8];
  shared_ptr<mocker::ast::BuiltinType> res;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  
  res.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)end._M_current;
  builtinType((Parser *)local_38,iter,end);
  id.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_
       = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (id.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_1_) {
    std::shared_ptr<mocker::ast::NonarrayType>::shared_ptr<mocker::ast::BuiltinType,void>
              ((shared_ptr<mocker::ast::NonarrayType> *)this,
               (shared_ptr<mocker::ast::BuiltinType> *)local_38);
  }
  id.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_3_
       = 0;
  std::shared_ptr<mocker::ast::BuiltinType>::~shared_ptr
            ((shared_ptr<mocker::ast::BuiltinType> *)local_38);
  _Var3._M_pi = extraout_RDX;
  if (id.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ == 0) {
    identifier((Parser *)local_58,iter,
               (TokIter)res.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
    if (bVar1) {
      this_00 = iter[2]._M_current;
      this_01 = std::
                __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_58);
      local_a0 = ast::ASTNode::getID(&this_01->super_ASTNode);
      pmVar2 = std::
               unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
               ::operator[]((unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                             *)this_00,&local_a0);
      local_98 = (pmVar2->first).line;
      sStack_90 = (pmVar2->first).col;
      local_88 = (pmVar2->second).line;
      sStack_80 = (pmVar2->second).col;
      p.first = pmVar2->first;
      p.second = pmVar2->second;
      makeNode<mocker::ast::UserDefinedType,std::shared_ptr<mocker::ast::Identifier>&>
                (&local_70,p,(shared_ptr<mocker::ast::Identifier> *)iter);
      std::shared_ptr<mocker::ast::NonarrayType>::shared_ptr<mocker::ast::UserDefinedType,void>
                ((shared_ptr<mocker::ast::NonarrayType> *)this,
                 (shared_ptr<mocker::ast::UserDefinedType> *)&local_70);
      std::shared_ptr<mocker::ast::UserDefinedType>::~shared_ptr
                ((shared_ptr<mocker::ast::UserDefinedType> *)&local_70);
    }
    id.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _5_3_ = 0;
    id.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_1_ = bVar1;
    std::shared_ptr<mocker::ast::Identifier>::~shared_ptr
              ((shared_ptr<mocker::ast::Identifier> *)local_58);
    _Var3._M_pi = extraout_RDX_00;
    if (id.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ._4_4_ == 0) {
      std::shared_ptr<mocker::ast::NonarrayType>::shared_ptr
                ((shared_ptr<mocker::ast::NonarrayType> *)this,(nullptr_t)0x0);
      _Var3._M_pi = extraout_RDX_01;
    }
  }
  sVar4.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  sVar4.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::NonarrayType>)
         sVar4.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::NonarrayType> Parser::nonarrayType(TokIter &iter,
                                                        TokIter end) {
  if (auto res = builtinType(iter, end))
    return res;
  if (auto id = identifier(iter, end))
    return makeNode<ast::UserDefinedType>(pos[id->getID()], id);
  return nullptr;
}